

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O0

t_int * voutlet_doepilog(t_int *w)

{
  long lVar1;
  undefined4 *local_30;
  t_sample *in;
  undefined4 *puStack_20;
  int n;
  t_sample *out;
  t_voutlet *x;
  t_int *w_local;
  
  lVar1 = w[1];
  puStack_20 = (undefined4 *)w[2];
  in._4_4_ = (int)w[3];
  local_30 = *(undefined4 **)(lVar1 + 0x58);
  if (*(int *)(lVar1 + 0x84) != *(int *)(lVar1 + 0x88)) {
    puStack_20 = *(undefined4 **)(lVar1 + 0x90);
  }
  while (in._4_4_ != 0) {
    *puStack_20 = *local_30;
    *local_30 = 0;
    local_30 = local_30 + 1;
    in._4_4_ = in._4_4_ + -1;
    puStack_20 = puStack_20 + 1;
  }
  if (local_30 == *(undefined4 **)(lVar1 + 0x50)) {
    local_30 = *(undefined4 **)(lVar1 + 0x48);
  }
  *(undefined4 **)(lVar1 + 0x58) = local_30;
  return w + 4;
}

Assistant:

static t_int *voutlet_doepilog(t_int *w)
{
    t_voutlet *x = (t_voutlet *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);

    int n = (int)(w[3]);
    t_sample *in = x->x_empty;
    if (x->x_updown.downsample != x->x_updown.upsample)
        out = x->x_updown.s_vec;
    for (; n--; in++) *out++ = *in, *in = 0;
    if (in == x->x_endbuf) in = x->x_buf;
    x->x_empty = in;
    return (w+4);
}